

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O3

void __thiscall
despot::SimpleRockSampleParticleUpperBound::SimpleRockSampleParticleUpperBound
          (SimpleRockSampleParticleUpperBound *this,DSPOMDP *model)

{
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  long lVar1;
  pointer pdVar2;
  double *pdVar3;
  iterator iVar4;
  pointer pvVar5;
  double dVar6;
  double local_38;
  double local_30;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  *(undefined ***)this = &PTR__SimpleRockSampleParticleUpperBound_0010ac60;
  this_00 = &this->upper_bounds_;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->upper_bounds_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,3);
  pvVar5 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = _ParticleBelief * 10.0;
  iVar4._M_current =
       (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar4._M_current == pdVar2) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(pvVar5,iVar4,&local_38);
    pvVar5 = (this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar4._M_current =
         (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar4._M_current = local_38;
    iVar4._M_current = iVar4._M_current + 1;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current;
  }
  local_38 = _ParticleBelief * _ParticleBelief * 10.0 + 10.0;
  if (iVar4._M_current == pdVar2) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(pvVar5,iVar4,&local_38);
    pvVar5 = (this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar4._M_current = local_38;
    (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  local_38 = 10.0;
  iVar4._M_current =
       pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar4._M_current ==
      pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar5 + 1,iVar4,&local_38);
    pvVar5 = (this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    *iVar4._M_current = 10.0;
    pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  local_30 = _ParticleBelief;
  dVar6 = pow(_ParticleBelief,3.0);
  local_38 = local_30 * 10.0 + dVar6 * 10.0;
  iVar4._M_current =
       pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar4._M_current ==
      pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar5 + 1,iVar4,&local_38);
  }
  else {
    *iVar4._M_current = local_38;
    pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  pvVar5 = (this_00->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar1 = *(long *)&pvVar5[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data;
  pdVar3 = (double *)(lVar1 + 8);
  if (*pdVar3 <= 10.0 && *pdVar3 != 10.0) {
    *(undefined8 *)(lVar1 + 8) = 0x4024000000000000;
  }
  local_38 = 0.0;
  iVar4._M_current =
       *(pointer *)
        ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data + 8);
  pdVar3 = *(pointer *)
            ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  if (iVar4._M_current == pdVar3) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar5 + 2,iVar4,&local_38);
    pvVar5 = (this_00->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    iVar4._M_current =
         *(pointer *)
          ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + 8);
    pdVar3 = *(pointer *)
              ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 0x10);
  }
  else {
    *iVar4._M_current = 0.0;
    iVar4._M_current = iVar4._M_current + 1;
    *(double **)
     ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar4._M_current;
  }
  local_38 = 0.0;
  if (iVar4._M_current == pdVar3) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (pvVar5 + 2,iVar4,&local_38);
  }
  else {
    *iVar4._M_current = 0.0;
    *(double **)
     ((long)&pvVar5[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data + 8) = iVar4._M_current + 1;
  }
  return;
}

Assistant:

SimpleRockSampleParticleUpperBound(const DSPOMDP* model) {
		upper_bounds_.resize(3);
		upper_bounds_[0].push_back(Globals::Discount(1) * 10);
		upper_bounds_[0].push_back(10 + Globals::Discount(2) * 10);
		upper_bounds_[1].push_back(10);
		upper_bounds_[1].push_back(Globals::Discount(1) * 10 + Globals::Discount(3) * 10);
		if (upper_bounds_[1][1] < 10)
			upper_bounds_[1][1] = 10;
		upper_bounds_[2].push_back(0);
		upper_bounds_[2].push_back(0);
	}